

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O1

long __thiscall gl4cts::anon_unknown_0::BasicState2::Run(BasicState2 *this)

{
  GLenum GVar1;
  long lVar2;
  CallLogWrapper *this_00;
  uint index;
  GLint p;
  int local_1c;
  
  this_00 = &(this->super_VertexAttribBindingBase).super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vao);
  index = 0;
  while( true ) {
    glu::CallLogWrapper::glGetIntegeri_v(this_00,0x82d6,index,&local_1c);
    GVar1 = glu::CallLogWrapper::glGetError(this_00);
    if (GVar1 != 0) {
      anon_unknown_0::Output
                ("glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, ...) command generates error.\n");
      goto LAB_00a07e12;
    }
    if (local_1c != 0) break;
    index = index + 1;
    if (index == 0x10) {
      glu::CallLogWrapper::glVertexBindingDivisor(this_00,1,2);
      glu::CallLogWrapper::glGetIntegeri_v(this_00,0x82d6,1,&local_1c);
      if (local_1c == 2) {
        lVar2 = 0;
      }
      else {
        anon_unknown_0::Output("GL_VERTEX_ATTRIB_ARRAY_DIVISOR(1) is %d should be 2.\n");
LAB_00a07e12:
        lVar2 = -1;
      }
      return lVar2;
    }
  }
  anon_unknown_0::Output("GL_VERTEX_BINDING_DIVISOR(%u) is %d should be 0.\n",(ulong)index);
  goto LAB_00a07e12;
}

Assistant:

virtual long Run()
	{
		GLint p;
		glBindVertexArray(m_vao);
		for (GLuint i = 0; i < 16; ++i)
		{
			glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, i, &p);
			if (glGetError() != GL_NO_ERROR)
			{
				Output("glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, ...) command generates error.\n");
				return ERROR;
			}
			if (p != 0)
			{
				Output("GL_VERTEX_BINDING_DIVISOR(%u) is %d should be 0.\n", i, p);
				return ERROR;
			}
		}
		glVertexBindingDivisor(1, 2);
		glGetIntegeri_v(GL_VERTEX_BINDING_DIVISOR, 1, &p);
		if (p != 2)
		{
			Output("GL_VERTEX_ATTRIB_ARRAY_DIVISOR(1) is %d should be 2.\n", p);
			return ERROR;
		}
		return NO_ERROR;
	}